

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stop_Freeze_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::Stop_Freeze_PDU::Stop_Freeze_PDU
          (Stop_Freeze_PDU *this,EntityIdentifier *ReceivingEntity,EntityIdentifier *SupplyingEntity
          ,ClockTime *RealWorldTime,StopFreezeReason SFR,FrozenBehavior FB,KUINT32 ReqID)

{
  KUINT32 KVar1;
  
  Simulation_Management_Header::Simulation_Management_Header
            (&this->super_Simulation_Management_Header,ReceivingEntity,SupplyingEntity);
  (this->super_Simulation_Management_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Stop_Freeze_PDU_002240f8;
  (this->m_RealWorldTime).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_002250a0;
  KVar1 = RealWorldTime->m_ui32TimePastHour;
  (this->m_RealWorldTime).m_i32Hour = RealWorldTime->m_i32Hour;
  (this->m_RealWorldTime).m_ui32TimePastHour = KVar1;
  this->m_ui8Reason = (KUINT8)SFR;
  this->m_ui8FrozenBehaviour = (KUINT8)FB;
  this->m_ui16Padding = 0;
  this->m_ui32RequestID = ReqID;
  (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui8PDUType = '\x0e';
  (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui16PDULength = 0x28;
  return;
}

Assistant:

Stop_Freeze_PDU::Stop_Freeze_PDU( const EntityIdentifier & ReceivingEntity, const EntityIdentifier & SupplyingEntity,
                                  const ClockTime & RealWorldTime, StopFreezeReason SFR, FrozenBehavior FB, KUINT32 ReqID ) :
    Simulation_Management_Header( ReceivingEntity, SupplyingEntity ),
    m_RealWorldTime( RealWorldTime ),
    m_ui8Reason( SFR ),
    m_ui8FrozenBehaviour( FB ),
    m_ui16Padding( 0 ),
    m_ui32RequestID( ReqID )
{
    m_ui8PDUType = Stop_Freeze_PDU_Type;
    m_ui16PDULength = STOP_FREEZE_PDU_SIZE;
}